

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.h
# Opt level: O3

int __thiscall
rlib::sequencer::MmlCompiler::EventNote::clone
          (EventNote *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x38);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_00178c78;
  puVar2[3] = *(undefined8 *)(__fn + 8);
  puVar2[2] = &PTR__Event_00178cc8;
  *(__fn *)(puVar2 + 6) = __fn[0x20];
  uVar1 = *(undefined8 *)(__fn + 0x18);
  puVar2[4] = *(undefined8 *)(__fn + 0x10);
  puVar2[5] = uVar1;
  (this->super_Event)._vptr_Event = (_func_int **)(puVar2 + 2);
  (this->super_Event).position = (size_t)puVar2;
  return (int)this;
}

Assistant:

virtual std::shared_ptr<Event> clone()const {
				return std::make_shared<EventNote>(*this);
			}